

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O1

Vec_Str_t * Saig_SynchSequence(Aig_Man_t *pAig,int nWords)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *vSequence;
  void **ppvVar4;
  Vec_Ptr_t *vSimInfo;
  int iVar5;
  void **ppvVar6;
  long lVar7;
  int iVar8;
  int iPatBest;
  uint local_48;
  int local_44;
  void **local_40;
  Vec_Ptr_t *local_38;
  
  if (pAig->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                  ,0x19c,"Vec_Str_t *Saig_SynchSequence(Aig_Man_t *, int)");
  }
  Aig_ManRandom(1);
  iVar8 = pAig->nRegs;
  vSequence = (Vec_Ptr_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar8 * 0x14 - 1U) {
    iVar5 = iVar8 * 0x14;
  }
  vSequence->nSize = 0;
  vSequence->nCap = iVar5;
  if (iVar5 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar5);
  }
  vSequence->pArray = ppvVar4;
  iVar8 = pAig->vObjs->nSize;
  lVar7 = (long)iVar8;
  local_40 = (void **)malloc(((long)nWords * 4 + 8) * lVar7);
  if (0 < lVar7) {
    ppvVar4 = local_40 + lVar7;
    ppvVar6 = local_40;
    do {
      *ppvVar6 = ppvVar4;
      ppvVar6 = ppvVar6 + 1;
      ppvVar4 = (void **)((long)ppvVar4 + (long)nWords * 4);
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  vSimInfo = (Vec_Ptr_t *)malloc(0x10);
  vSimInfo->nSize = iVar8;
  vSimInfo->nCap = iVar8;
  vSimInfo->pArray = local_40;
  Saig_SynchSetConstant1(pAig,vSimInfo,nWords);
  uVar3 = pAig->nRegs;
  Saig_SynchInitRegsTernary(pAig,vSimInfo,nWords);
  bVar1 = 0 < (int)uVar3;
  if (0 < (int)uVar3) {
    local_48 = 0;
    local_38 = vSequence;
    do {
      iVar8 = 0;
      do {
        Saig_SynchInitPisRandom(pAig,vSimInfo,nWords);
        Saig_SynchTernarySimulate(pAig,vSimInfo,nWords);
        uVar2 = Saig_SynchCountX(pAig,vSimInfo,nWords,&local_44);
        vSequence = local_38;
        if ((int)uVar2 < (int)uVar3) goto LAB_006eee6d;
        iVar8 = iVar8 + 1;
      } while (iVar8 != 100);
      iVar8 = 100;
LAB_006eee6d:
      if (iVar8 == 100) break;
      uVar3 = Saig_SynchSavePattern(pAig,vSimInfo,nWords,local_44,(Vec_Str_t *)local_38);
      if (uVar2 != uVar3) {
        __assert_fail("nTerCur == nTerCur2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                      ,0x1b4,"Vec_Str_t *Saig_SynchSequence(Aig_Man_t *, int)");
      }
      bVar1 = 0 < (int)uVar2;
      uVar3 = uVar2;
      if ((0x62 < local_48) || (local_48 = local_48 + 1, (int)uVar2 < 1)) break;
    } while( true );
  }
  if (bVar1) {
    printf("Count not initialize %d registers.\n",(ulong)uVar3);
    if (local_40 != (void **)0x0) {
      free(local_40);
      vSimInfo->pArray = (void **)0x0;
    }
    free(vSimInfo);
    ppvVar4 = vSequence->pArray;
    vSimInfo = vSequence;
    vSequence = (Vec_Ptr_t *)0x0;
  }
  else {
    iVar8 = Saig_SynchSequenceRun(pAig,vSimInfo,(Vec_Str_t *)vSequence,1);
    if (iVar8 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                    ,0x1c2,"Vec_Str_t *Saig_SynchSequence(Aig_Man_t *, int)");
    }
    Aig_ManCleanMarkA(pAig);
    ppvVar4 = local_40;
  }
  if (ppvVar4 != (void **)0x0) {
    free(ppvVar4);
    vSimInfo->pArray = (void **)0x0;
  }
  free(vSimInfo);
  return (Vec_Str_t *)vSequence;
}

Assistant:

Vec_Str_t * Saig_SynchSequence( Aig_Man_t * pAig, int nWords )
{
    int nStepsMax = 100;  // the maximum number of simulation steps
    int nTriesMax = 100;  // the maximum number of attempts at each step
    int fVerify   =   1;  // verify the resulting pattern
    Vec_Str_t * vSequence;
    Vec_Ptr_t * vSimInfo;
    int nTerPrev, nTerCur = 0, nTerCur2;
    int iPatBest, RetValue, s, t;
    assert( Saig_ManRegNum(pAig) > 0 );
    // reset random numbers
    Aig_ManRandom( 1 );
    // start the sequence
    vSequence = Vec_StrAlloc( 20 * Saig_ManRegNum(pAig) );
    // create sim info and init registers
    vSimInfo = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(pAig), nWords );
    Saig_SynchSetConstant1( pAig, vSimInfo, nWords );
    // iterate over the timeframes
    nTerPrev = Saig_ManRegNum(pAig);
    Saig_SynchInitRegsTernary( pAig, vSimInfo, nWords );
    for ( s = 0; s < nStepsMax && nTerPrev > 0; s++ )
    {
        for ( t = 0; t < nTriesMax; t++ )
        {
            Saig_SynchInitPisRandom( pAig, vSimInfo, nWords );
            Saig_SynchTernarySimulate( pAig, vSimInfo, nWords );
            nTerCur = Saig_SynchCountX( pAig, vSimInfo, nWords, &iPatBest );
            if ( nTerCur < nTerPrev )
                break;
        }
        if ( t == nTriesMax )
            break;
        nTerCur2 = Saig_SynchSavePattern( pAig, vSimInfo, nWords, iPatBest, vSequence );
        assert( nTerCur == nTerCur2 );
        nTerPrev = nTerCur;
    }
    if ( nTerPrev > 0 )
    {
        printf( "Count not initialize %d registers.\n", nTerPrev );
        Vec_PtrFree( vSimInfo );
        Vec_StrFree( vSequence );
        return NULL;
    }
    // verify that the sequence is correct
    if ( fVerify )
    {
        RetValue = Saig_SynchSequenceRun( pAig, vSimInfo, vSequence, 1 );
        assert( RetValue == 0 );
        Aig_ManCleanMarkA( pAig );
    }
    Vec_PtrFree( vSimInfo );
    return vSequence;
}